

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O3

void TestMap<TCMalloc_PageMap1<10>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  ulong uVar1;
  size_t __i;
  void *pvVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  AssertHelperData *pAVar6;
  AssertHelperData *pAVar7;
  undefined1 local_13f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13f0 [623];
  size_t local_78;
  ulong local_70;
  AssertHelperData *local_68;
  AssertHelper local_60;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Stack_58;
  vector<long,_std::allocator<long>_> elements;
  AssertHelper AStack_38;
  bool limit_is_below_the_overflow_boundary_local;
  
  uVar1 = (ulong)(uint)limit;
  elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n",uVar1);
  pvVar2 = calloc(1,0x2000);
  local_68 = (AssertHelperData *)(long)limit;
  local_70 = uVar1;
  if (0 < limit) {
    pAVar7 = (AssertHelperData *)0x0;
    do {
      pAVar6 = (AssertHelperData *)((long)&pAVar7->type + 1);
      *(AssertHelperData **)((long)pvVar2 + (long)pAVar7 * 8) = pAVar6;
      _Stack_58._M_current = (long *)(AssertHelperData *)0x0;
      if (pAVar7 < (AssertHelperData *)0x400) {
        _Stack_58._M_current = (long *)pAVar6;
      }
      AStack_38.data_ = pAVar6;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)local_13f8,"map.get(i)","(void*)(i+1)",&_Stack_58._M_current,
                 &stack0xffffffffffffffc8.data_);
      if (local_13f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&_Stack_58);
        if (local_13f0[0] ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&stack0xffffffffffffffc8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3b,pcVar5);
        testing::internal::AssertHelper::operator=(&stack0xffffffffffffffc8,(Message *)&_Stack_58);
        goto LAB_001093f3;
      }
      if (local_13f0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_13f0,local_13f0[0]);
      }
      pAVar7 = pAVar6;
    } while (local_68 != pAVar6);
    if (0 < (int)local_70) {
      pAVar7 = (AssertHelperData *)0x0;
      do {
        if (pAVar7 < (AssertHelperData *)0x400) {
          _Stack_58._M_current = *(long **)((long)pvVar2 + (long)pAVar7 * 8);
        }
        else {
          _Stack_58._M_current = (long *)0x0;
        }
        pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
        AStack_38.data_ = pAVar7;
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)local_13f8,"map.get(i)","(void*)(i+1)",&_Stack_58._M_current,
                   &stack0xffffffffffffffc8.data_);
        if (local_13f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&_Stack_58);
          if (local_13f0[0] ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&stack0xffffffffffffffc8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x3e,pcVar5);
          testing::internal::AssertHelper::operator=(&stack0xffffffffffffffc8,(Message *)&_Stack_58)
          ;
          goto LAB_001093f3;
        }
        if (local_13f0[0] !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_13f0,local_13f0[0]);
        }
      } while (local_68 != pAVar7);
      pvVar2 = calloc(1,0x2000);
      if (0 < (int)local_70) {
        pAVar7 = (AssertHelperData *)0x0;
        do {
          pAVar6 = (AssertHelperData *)((long)&pAVar7->type + 1);
          *(AssertHelperData **)((long)pvVar2 + (long)pAVar7 * 8) = pAVar6;
          _Stack_58._M_current = (long *)(AssertHelperData *)0x0;
          if (pAVar7 < (AssertHelperData *)0x400) {
            _Stack_58._M_current = (long *)pAVar6;
          }
          AStack_38.data_ = pAVar6;
          testing::internal::CmpHelperEQ<void*,void*>
                    ((internal *)local_13f8,"map.get(i)","(void*)(i+1)",&_Stack_58._M_current,
                     &stack0xffffffffffffffc8.data_);
          if (local_13f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&_Stack_58);
            if (local_13f0[0] ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&stack0xffffffffffffffc8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                       ,0x47,pcVar5);
            testing::internal::AssertHelper::operator=
                      (&stack0xffffffffffffffc8,(Message *)&_Stack_58);
            goto LAB_001093f3;
          }
          if (local_13f0[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_13f0,local_13f0[0]);
          }
          pAVar7 = pAVar6;
        } while (local_68 != pAVar6);
        if (0 < (int)local_70) {
          pAVar7 = (AssertHelperData *)0x0;
          do {
            if (pAVar7 < (AssertHelperData *)0x400) {
              _Stack_58._M_current = *(long **)((long)pvVar2 + (long)pAVar7 * 8);
            }
            else {
              _Stack_58._M_current = (long *)0x0;
            }
            pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
            AStack_38.data_ = pAVar7;
            testing::internal::CmpHelperEQ<void*,void*>
                      ((internal *)local_13f8,"map.get(i)","(void*)(i+1)",&_Stack_58._M_current,
                       &stack0xffffffffffffffc8.data_);
            if (local_13f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&_Stack_58);
              if (local_13f0[0] ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&stack0xffffffffffffffc8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                         ,0x4a,pcVar5);
              testing::internal::AssertHelper::operator=
                        (&stack0xffffffffffffffc8,(Message *)&_Stack_58);
LAB_001093f3:
              testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffc8);
              if (_Stack_58._M_current != (long *)0x0) {
                (**(code **)(*_Stack_58._M_current + 8))();
              }
              if (local_13f0[0] ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                return;
              }
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_13f0,local_13f0[0]);
              return;
            }
            if (local_13f0[0] !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_13f0,local_13f0[0]);
            }
          } while (local_68 != pAVar7);
        }
      }
    }
  }
  _Stack_58._M_current._0_1_ = (ulong)(long)((int)local_70 + 1) <= 0x400U - (long)local_68;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_13f8,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)&_Stack_58,
             (bool *)((long)&elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
  if (local_13f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&_Stack_58);
    if (local_13f0[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffc8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar5);
    testing::internal::AssertHelper::operator=(&stack0xffffffffffffffc8,(Message *)&_Stack_58);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffc8);
    if (_Stack_58._M_current != (long *)0x0) {
      (**(code **)(*_Stack_58._M_current + 8))();
    }
  }
  if (local_13f0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_13f0,local_13f0[0]);
  }
  if (local_13f8[0] != (internal)0x0) {
    _Stack_58._M_current = (long *)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_13f8 = (undefined1  [8])0x0;
    if (0 < (int)local_70) {
      do {
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&_Stack_58,
                     (iterator)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start,(long *)local_13f8);
        }
        else {
          *elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start = (long)local_13f8;
          elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        }
        local_13f8 = (undefined1  [8])((long)local_13f8 + 1);
      } while ((long)local_13f8 < (long)local_68);
    }
    local_13f8 = (undefined1  [8])0x2a;
    lVar3 = 1;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a;
    do {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(((uint)((ulong)pbVar4 >> 0x1e) ^ (uint)pbVar4) * 0x6c078965 + (int)lVar3);
      local_13f0[lVar3 + -1] = pbVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    local_78 = 0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_Stack_58,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_13f8);
    pvVar2 = calloc(1,0x2000);
    if (0 < (int)local_70) {
      pAVar7 = (AssertHelperData *)0x0;
      do {
        uVar1 = _Stack_58._M_current[(long)pAVar7];
        local_60.data_ = (AssertHelperData *)(uVar1 + 1);
        *(AssertHelperData **)((long)pvVar2 + uVar1 * 8) = local_60.data_;
        AStack_38.data_ = (AssertHelperData *)0x0;
        if (uVar1 < 0x400) {
          AStack_38.data_ = local_60.data_;
        }
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)local_13f8,"map.get(elements[i])","(void*)(elements[i]+1)",
                   &stack0xffffffffffffffc8.data_,&local_60.data_);
        if (local_13f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffc8);
          if (local_13f0[0] ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x5d,pcVar5);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffffc8);
          goto LAB_00109360;
        }
        if (local_13f0[0] !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_13f0,local_13f0[0]);
        }
        pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
      } while (local_68 != pAVar7);
      if (0 < (int)local_70) {
        pAVar7 = (AssertHelperData *)0x0;
LAB_001091c9:
        if (pAVar7 < (AssertHelperData *)0x400) {
          AStack_38.data_ = *(AssertHelperData **)((long)pvVar2 + (long)pAVar7 * 8);
        }
        else {
          AStack_38.data_ = (AssertHelperData *)0x0;
        }
        pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
        local_60.data_ = pAVar7;
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)local_13f8,"map.get(i)","(void*)(i+1)",&stack0xffffffffffffffc8.data_
                   ,&local_60.data_);
        if (local_13f8[0] != (internal)0x0) goto code_r0x0010920e;
        testing::Message::Message((Message *)&stack0xffffffffffffffc8);
        if (local_13f0[0] ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_13f0[0]->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x60,pcVar5);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffffc8);
LAB_00109360:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (AStack_38.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)AStack_38.data_ + 8))();
        }
        if (local_13f0[0] !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_13f0,local_13f0[0]);
        }
      }
    }
LAB_00109390:
    if (_Stack_58._M_current != (long *)0x0) {
      operator_delete(_Stack_58._M_current,
                      (long)elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)_Stack_58._M_current);
    }
  }
  return;
code_r0x0010920e:
  if (local_13f0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_13f0,local_13f0[0]);
  }
  if (local_68 == pAVar7) goto LAB_00109390;
  goto LAB_001091c9;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}